

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O3

void __thiscall Item::PrintItem(Item *this)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->cost);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Item Type: ",0xb);
  switch(this->typeI) {
  case KATANA:
    pcVar4 = "Katana";
    lVar3 = 6;
    break;
  case SPEAR:
    pcVar4 = "Spear";
    lVar3 = 5;
    break;
  case BOW:
    pcVar4 = "Bow";
    lVar3 = 3;
    break;
  case NINJATO:
    pcVar4 = "Ninjato";
    lVar3 = 7;
    break;
  case WAKIZASHI:
    pcVar4 = "Wakizashi";
    lVar3 = 9;
    break;
  default:
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (this->tapped == true) {
    pcVar4 = "Tapped: yes";
    lVar3 = 0xb;
  }
  else {
    pcVar4 = "Tapped: no";
    lVar3 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Attack: ",8);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->attackBonus);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Defense: ",9);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->defenseBonus);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Minimum Honor Required: ",0x18);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->minimumHonor);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Effect Bonus: ",0xe);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->effectBonus);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Effect Cost: ",0xd);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->effectCost);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card text: ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->cardText)._M_dataplus._M_p,
                      (this->cardText)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Durability: ",0xc);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->durability);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void Item::PrintItem()                  //prints item's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << cost << endl;

    cout << "Item Type: ";
    if (typeI == KATANA)
        cout << "Katana"<< endl;
    else if (typeI == SPEAR)
        cout << "Spear"<< endl;
    else if (typeI == BOW)
        cout << "Bow"<< endl;
    else if (typeI == NINJATO)
        cout << "Ninjato"<< endl;
    else if (typeI == WAKIZASHI)
        cout << "Wakizashi"<< endl;
    else return;

    if (tapped)
        cout << "Tapped: yes"<<endl;
    else
        cout <<"Tapped: no"<<endl;

    cout << "Attack: " << attackBonus << endl;
    cout << "Defense: " << defenseBonus << endl;
    cout << "Minimum Honor Required: " << minimumHonor << endl;

    cout << "Effect Bonus: " << effectBonus << endl;
    cout << "Effect Cost: " << effectCost << endl;

    cout << "Card text: " << cardText << endl;

    cout << "Durability: "<<durability<<endl;
    cout << endl;
}